

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

void testing::internal::PrintTo(wchar_t *s,ostream *os)

{
  ostream *os_local;
  wchar_t *s_local;
  
  anon_unknown_20::PrintCStringTo<wchar_t>(s,os);
  return;
}

Assistant:

void PrintTo(const wchar_t* s, ostream* os) { PrintCStringTo(s, os); }